

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_functions.c
# Opt level: O1

void WebRtcIsac_AllPoleFilter(double *InOut,double *Coef,size_t lengthInOut,int orderCoef)

{
  size_t sVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = *Coef;
  if ((dVar4 <= 0.9999) || (1.0001 <= dVar4)) {
    if (lengthInOut != 0) {
      sVar1 = 0;
      do {
        *InOut = *InOut * (1.0 / dVar4);
        if (0 < orderCoef) {
          dVar5 = *InOut;
          lVar2 = -1;
          pdVar3 = Coef + 1;
          do {
            dVar5 = dVar5 + *pdVar3 * -(1.0 / dVar4) * InOut[lVar2];
            *InOut = dVar5;
            lVar2 = lVar2 + -1;
            pdVar3 = pdVar3 + 1;
          } while (-lVar2 != (ulong)(orderCoef + 1));
        }
        InOut = InOut + 1;
        sVar1 = sVar1 + 1;
      } while (sVar1 != lengthInOut);
    }
  }
  else if (lengthInOut != 0) {
    sVar1 = 0;
    do {
      dVar4 = Coef[1] * InOut[-1];
      if (1 < orderCoef) {
        lVar2 = -2;
        pdVar3 = Coef + 2;
        do {
          dVar4 = dVar4 + *pdVar3 * InOut[lVar2];
          lVar2 = lVar2 + -1;
          pdVar3 = pdVar3 + 1;
        } while (-lVar2 != (ulong)(orderCoef + 1));
      }
      *InOut = *InOut - dVar4;
      InOut = InOut + 1;
      sVar1 = sVar1 + 1;
    } while (sVar1 != lengthInOut);
  }
  return;
}

Assistant:

void WebRtcIsac_AllPoleFilter(double* InOut,
                              double* Coef,
                              size_t lengthInOut,
                              int orderCoef) {
  /* the state of filter is assumed to be in InOut[-1] to InOut[-orderCoef] */
  double scal;
  double sum;
  size_t n;
  int k;

  //if (fabs(Coef[0]-1.0)<0.001) {
  if ( (Coef[0] > 0.9999) && (Coef[0] < 1.0001) )
  {
    for(n = 0; n < lengthInOut; n++)
    {
      sum = Coef[1] * InOut[-1];
      for(k = 2; k <= orderCoef; k++){
        sum += Coef[k] * InOut[-k];
      }
      *InOut++ -= sum;
    }
  }
  else
  {
    scal = 1.0 / Coef[0];
    for(n=0;n<lengthInOut;n++)
    {
      *InOut *= scal;
      for(k=1;k<=orderCoef;k++){
        *InOut -= scal*Coef[k]*InOut[-k];
      }
      InOut++;
    }
  }
}